

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void empty_queue(event_path_data evp,queue_ptr queue)

{
  void *__ptr;
  long *in_RSI;
  bool bVar1;
  queue_item *tmp;
  
  while( true ) {
    bVar1 = false;
    if (*in_RSI != 0) {
      bVar1 = in_RSI[1] != 0;
    }
    if (!bVar1) break;
    __ptr = (void *)*in_RSI;
    return_event(evp,(event_item *)queue);
    if (*in_RSI == in_RSI[1]) {
      *in_RSI = 0;
      in_RSI[1] = 0;
    }
    else {
      *in_RSI = *(long *)(*in_RSI + 0x10);
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void
empty_queue(event_path_data evp, queue_ptr queue)
{
    while(queue->queue_head != NULL && queue->queue_tail != NULL) {
	queue_item *tmp = queue->queue_head;
	return_event(evp, queue->queue_head->item);
        if(queue->queue_head == queue->queue_tail) {
	    queue->queue_head = NULL;
	    queue->queue_tail = NULL;
	} else {
	    queue->queue_head = queue->queue_head->next;
	}
	free(tmp);
    }
}